

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O1

void ihevc_intra_pred_luma_horz
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  ulong uVar1;
  UWORD8 *pUVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar3 = (ulong)(uint)(nt * 2);
  if (nt == 0x20) {
    uVar1 = 0;
    do {
      lVar4 = 0;
      do {
        pu1_dst[lVar4] = pu1_ref[~uVar1 + uVar3];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x20);
      uVar1 = uVar1 + 1;
      pu1_dst = pu1_dst + dst_strd;
    } while (uVar1 != 0x20);
  }
  else {
    uVar1 = (ulong)(uint)nt;
    if (0 < nt) {
      uVar6 = 0;
      do {
        uVar7 = ((int)((uint)pu1_ref[uVar6 + uVar3 + 1] - (uint)pu1_ref[uVar3]) >> 1) +
                (uint)pu1_ref[uVar3 - 1];
        if ((short)uVar7 < 1) {
          uVar7 = 0;
        }
        uVar7 = uVar7 & 0xffff;
        if (0xfe < uVar7) {
          uVar7 = 0xff;
        }
        pu1_dst[uVar6] = (UWORD8)uVar7;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    if (1 < nt) {
      pUVar2 = pu1_dst + dst_strd;
      uVar6 = 1;
      do {
        uVar5 = 0;
        do {
          pUVar2[uVar5] = pu1_ref[~uVar6 + uVar3];
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
        uVar6 = uVar6 + 1;
        pUVar2 = pUVar2 + dst_strd;
      } while (uVar6 != uVar1);
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_horz(UWORD8 *pu1_ref,
                                WORD32 src_strd,
                                UWORD8 *pu1_dst,
                                WORD32 dst_strd,
                                WORD32 nt,
                                WORD32 mode)
{

    WORD32 row, col;
    WORD32 two_nt;
    WORD16 s2_predpixel;
    UNUSED(mode);
    UNUSED(src_strd);
    two_nt = 2 * nt;

    if(nt == 32)
    {
        for(row = 0; row < nt; row++)
            for(col = 0; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];
    }
    else
    {
        /*Filtering done for the 1st row */
        for(col = 0; col < nt; col++)
        {
            s2_predpixel = pu1_ref[two_nt - 1]
                            + ((pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt]) >> 1);
            pu1_dst[col] = CLIP_U8(s2_predpixel);
        }

        /* Replication to next rows*/
        for(row = 1; row < nt; row++)
            for(col = 0; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];
    }
}